

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_decoder.cc
# Opt level: O3

bool __thiscall draco::MeshSequentialDecoder::DecodeConnectivity(MeshSequentialDecoder *this)

{
  pointer *ppaVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined4 uVar6;
  DecoderBuffer *pDVar7;
  long lVar8;
  Mesh *pMVar9;
  iterator iVar10;
  bool bVar11;
  long lVar12;
  uint num_faces;
  long lVar13;
  uint uVar14;
  int j;
  uint uVar15;
  long lVar16;
  Face face;
  uint32_t num_points;
  uint32_t val;
  undefined8 uStack_50;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> local_48;
  uint local_3c;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_38;
  uint local_34;
  
  uVar4._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar4._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  pDVar7 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((ushort)(uVar4 << 8 | uVar4 >> 8) < 0x202) {
    lVar8 = pDVar7->pos_;
    lVar16 = lVar8 + 4;
    if (pDVar7->data_size_ < lVar16) {
      return false;
    }
    num_faces = *(uint *)(pDVar7->data_ + lVar8);
    pDVar7->pos_ = lVar16;
    if (pDVar7->data_size_ < lVar8 + 8) {
      return false;
    }
    local_3c = *(uint *)(pDVar7->data_ + lVar16);
    pDVar7->pos_ = lVar8 + 8;
  }
  else {
    uStack_50 = 0x136f31;
    bVar11 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>(1,&local_34,pDVar7);
    if (!bVar11) {
      return false;
    }
    uStack_50 = 0x136f48;
    bVar11 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>
                       (1,&local_3c,(this->super_MeshDecoder).super_PointCloudDecoder.buffer_);
    num_faces = local_34;
    if (!bVar11) {
      return false;
    }
  }
  uVar14 = local_3c;
  if (num_faces < 0x55555556) {
    pDVar7 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    lVar16 = pDVar7->pos_;
    if (((ulong)num_faces <= (ulong)((pDVar7->data_size_ - lVar16) / 3)) &&
       (lVar16 + 1 <= pDVar7->data_size_)) {
      cVar2 = pDVar7->data_[lVar16];
      pDVar7->pos_ = lVar16 + 1;
      if (cVar2 == '\0') {
        uStack_50 = 0x13706c;
        bVar11 = DecodeAndDecompressIndices(this,num_faces);
        uVar14 = local_3c;
        if (!bVar11) {
          return false;
        }
      }
      else if (local_3c < 0x100) {
        if (num_faces != 0) {
          uVar15 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            pDVar7 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
            lVar16 = pDVar7->data_size_;
            lVar13 = 0;
            lVar8 = pDVar7->pos_;
            do {
              lVar12 = lVar8 + 1;
              if (lVar16 < lVar12) {
                return false;
              }
              bVar3 = pDVar7->data_[lVar8];
              pDVar7->pos_ = lVar12;
              *(uint *)((long)&local_48._M_elems[0].value_ + lVar13) = (uint)bVar3;
              lVar13 = lVar13 + 4;
              lVar8 = lVar12;
            } while (lVar13 != 0xc);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              uStack_50 = 0x137051;
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar1 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != num_faces);
        }
      }
      else if (local_3c < 0x10000) {
        if (num_faces != 0) {
          uVar15 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            pDVar7 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
            lVar16 = pDVar7->data_size_;
            lVar13 = 0;
            lVar8 = pDVar7->pos_;
            do {
              lVar12 = lVar8 + 2;
              if (lVar16 < lVar12) {
                return false;
              }
              uVar4 = *(ushort *)(pDVar7->data_ + lVar8);
              pDVar7->pos_ = lVar12;
              *(uint *)((long)&local_48._M_elems[0].value_ + lVar13) = (uint)uVar4;
              lVar13 = lVar13 + 4;
              lVar8 = lVar12;
            } while (lVar13 != 0xc);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              uStack_50 = 0x13711c;
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar1 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != num_faces);
        }
      }
      else if ((local_3c < 0x200000) &&
              (uVar5._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_,
              uVar5._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_,
              0x201 < (ushort)(uVar5 << 8 | uVar5 >> 8))) {
        if (num_faces != 0) {
          uVar15 = 0;
          do {
            local_48._M_elems[2].value_ = 0;
            local_48._M_elems[0].value_ = 0;
            local_48._M_elems[1].value_ = 0;
            lVar16 = 0;
            do {
              uStack_50 = 0x137184;
              bVar11 = anon_unknown_18::DecodeVarintUnsigned<unsigned_int>
                                 (1,&local_38.value_,
                                  (this->super_MeshDecoder).super_PointCloudDecoder.buffer_);
              if (!bVar11) {
                return false;
              }
              local_48._M_elems[lVar16].value_ = local_38.value_;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            pMVar9 = (this->super_MeshDecoder).mesh_;
            iVar10._M_current =
                 (pMVar9->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar10._M_current ==
                (pMVar9->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              uStack_50 = 0x1371d8;
              std::
              vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
              ::
              _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                        ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                          *)&pMVar9->faces_,iVar10,&local_48);
            }
            else {
              (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
              *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
              ppaVar1 = &(pMVar9->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != num_faces);
        }
      }
      else if (num_faces != 0) {
        uVar15 = 0;
        do {
          local_48._M_elems[2].value_ = 0;
          local_48._M_elems[0].value_ = 0;
          local_48._M_elems[1].value_ = 0;
          pDVar7 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
          lVar16 = pDVar7->data_size_;
          lVar13 = 4;
          lVar8 = pDVar7->pos_;
          do {
            lVar12 = lVar8 + 4;
            if (lVar16 < lVar12) {
              return false;
            }
            uVar6 = *(undefined4 *)(pDVar7->data_ + lVar8);
            pDVar7->pos_ = lVar12;
            *(undefined4 *)((long)&uStack_50 + lVar13 + 4) = uVar6;
            lVar13 = lVar13 + 4;
            lVar8 = lVar12;
          } while (lVar13 != 0x10);
          pMVar9 = (this->super_MeshDecoder).mesh_;
          iVar10._M_current =
               (pMVar9->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (pMVar9->faces_).vector_.
              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            uStack_50 = 0x137279;
            std::
            vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
            ::
            _M_realloc_insert<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>const&>
                      ((vector<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>,std::allocator<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>>
                        *)&pMVar9->faces_,iVar10,&local_48);
          }
          else {
            (iVar10._M_current)->_M_elems[2].value_ = local_48._M_elems[2].value_;
            *(undefined8 *)(iVar10._M_current)->_M_elems = local_48._M_elems._0_8_;
            ppaVar1 = &(pMVar9->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != num_faces);
      }
      ((this->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ = uVar14;
      return true;
    }
  }
  return false;
}

Assistant:

bool MeshSequentialDecoder::DecodeConnectivity() {
  uint32_t num_faces;
  uint32_t num_points;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer()->Decode(&num_faces)) {
      return false;
    }
    if (!buffer()->Decode(&num_points)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, buffer())) {
      return false;
    }
    if (!DecodeVarint(&num_points, buffer())) {
      return false;
    }
  }

  // Check that num_faces and num_points are valid values.
  const uint64_t faces_64 = static_cast<uint64_t>(num_faces);
  // Compressed sequential encoding can only handle (2^32 - 1) / 3 indices.
  if (faces_64 > 0xffffffff / 3) {
    return false;
  }
  if (faces_64 > buffer()->remaining_size() / 3) {
    // The number of faces is unreasonably high, because face indices do not
    // fit in the remaining size of the buffer.
    return false;
  }
  uint8_t connectivity_method;
  if (!buffer()->Decode(&connectivity_method)) {
    return false;
  }
  if (connectivity_method == 0) {
    if (!DecodeAndDecompressIndices(num_faces)) {
      return false;
    }
  } else {
    if (num_points < 256) {
      // Decode indices as uint8_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint8_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 16)) {
      // Decode indices as uint16_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint16_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 21) &&
               bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 2)) {
      // Decode indices as uint32_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!DecodeVarint(&val, buffer())) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else {
      // Decode faces as uint32_t (default).
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    }
  }
  point_cloud()->set_num_points(num_points);
  return true;
}